

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O0

pair<bool,_bool> __thiscall
spvtools::opt::UpgradeMemoryModel::CheckAllTypes(UpgradeMemoryModel *this,Instruction *inst)

{
  value_type pIVar1;
  bool bVar2;
  bool bVar3;
  Op OVar4;
  uint uVar5;
  uint32_t uVar6;
  int32_t iVar7;
  reference ppIVar8;
  IRContext *pIVar9;
  DefUseManager *pDVar10;
  pair<std::__detail::_Node_iterator<const_spvtools::opt::Instruction_*,_true,_false>,_bool> pVar11;
  Instruction *local_c0;
  Instruction *local_b8;
  Instruction *local_b0;
  uint local_a8;
  undefined4 local_a4;
  uint32_t i;
  byte local_98;
  _Node_iterator_base<const_spvtools::opt::Instruction_*,_false> local_90;
  byte local_88;
  value_type local_80;
  Instruction *def;
  undefined1 local_70 [6];
  bool is_volatile;
  bool is_coherent;
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  stack;
  unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
  visited;
  Instruction *inst_local;
  UpgradeMemoryModel *this_local;
  
  visited._M_h._M_single_bucket = (__node_base_ptr)inst;
  std::
  unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
  ::unordered_set((unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
                   *)&stack.
                      super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>::
  vector((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
          *)local_70);
  std::
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>::
  push_back((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
             *)local_70,(value_type *)&visited._M_h._M_single_bucket);
  def._7_1_ = 0;
  def._6_1_ = 0;
LAB_00292f75:
  do {
    do {
      bVar2 = std::
              vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
              ::empty((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                       *)local_70);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        this_local._6_2_ =
             std::make_pair<bool&,bool&>((bool *)((long)&def + 7),(bool *)((long)&def + 6));
LAB_00293225:
        local_a4 = 1;
        std::
        vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
        ::~vector((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                   *)local_70);
        std::
        unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
        ::~unordered_set((unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
                          *)&stack.
                             super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        return this_local._6_2_;
      }
      ppIVar8 = std::
                vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                ::back((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                        *)local_70);
      local_80 = *ppIVar8;
      std::
      vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
      ::pop_back((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                  *)local_70);
      pVar11 = std::
               unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
               ::insert((unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
                         *)&stack.
                            super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_80);
      _i = (__node_type *)
           pVar11.first.super__Node_iterator_base<const_spvtools::opt::Instruction_*,_false>._M_cur;
      local_98 = pVar11.second;
      local_90._M_cur = _i;
      local_88 = local_98;
    } while (((local_98 ^ 0xff) & 1) != 0);
    OVar4 = Instruction::opcode(local_80);
    pIVar1 = local_80;
    if (OVar4 == OpTypeStruct) {
      uVar5 = std::numeric_limits<unsigned_int>::max();
      bVar2 = HasDecoration(this,pIVar1,uVar5,Coherent);
      pIVar1 = local_80;
      def._7_1_ = (def._7_1_ & 1) != 0 || bVar2;
      uVar5 = std::numeric_limits<unsigned_int>::max();
      bVar3 = HasDecoration(this,pIVar1,uVar5,Volatile);
      bVar2 = (def._6_1_ & 1) != 0;
      def._6_1_ = bVar2 || bVar3;
      if (((def._7_1_ & 1) != 0) && (bVar2 || bVar3)) {
        this_local._6_2_ =
             std::make_pair<bool&,bool&>((bool *)((long)&def + 7),(bool *)((long)&def + 6));
        goto LAB_00293225;
      }
      for (local_a8 = 0; uVar5 = local_a8, uVar6 = Instruction::NumInOperands(local_80),
          uVar5 < uVar6; local_a8 = local_a8 + 1) {
        pIVar9 = Pass::context(&this->super_Pass);
        pDVar10 = IRContext::get_def_use_mgr(pIVar9);
        uVar6 = Instruction::GetSingleWordInOperand(local_80,local_a8);
        local_b0 = analysis::DefUseManager::GetDef(pDVar10,uVar6);
        std::
        vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
        ::push_back((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                     *)local_70,&local_b0);
      }
      goto LAB_00292f75;
    }
    OVar4 = Instruction::opcode(local_80);
    iVar7 = spvOpcodeIsComposite(OVar4);
    if (iVar7 == 0) {
      OVar4 = Instruction::opcode(local_80);
      if (OVar4 == OpTypePointer) {
        pIVar9 = Pass::context(&this->super_Pass);
        pDVar10 = IRContext::get_def_use_mgr(pIVar9);
        uVar6 = Instruction::GetSingleWordInOperand(local_80,1);
        local_c0 = analysis::DefUseManager::GetDef(pDVar10,uVar6);
        std::
        vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
        ::push_back((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                     *)local_70,&local_c0);
      }
    }
    else {
      pIVar9 = Pass::context(&this->super_Pass);
      pDVar10 = IRContext::get_def_use_mgr(pIVar9);
      uVar6 = Instruction::GetSingleWordInOperand(local_80,0);
      local_b8 = analysis::DefUseManager::GetDef(pDVar10,uVar6);
      std::
      vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
      ::push_back((vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                   *)local_70,&local_b8);
    }
  } while( true );
}

Assistant:

std::pair<bool, bool> UpgradeMemoryModel::CheckAllTypes(
    const Instruction* inst) {
  std::unordered_set<const Instruction*> visited;
  std::vector<const Instruction*> stack;
  stack.push_back(inst);

  bool is_coherent = false;
  bool is_volatile = false;
  while (!stack.empty()) {
    const Instruction* def = stack.back();
    stack.pop_back();

    if (!visited.insert(def).second) continue;

    if (def->opcode() == spv::Op::OpTypeStruct) {
      // Any member decorated with coherent and/or volatile is enough to have
      // the related operation be flagged as coherent and/or volatile.
      is_coherent |= HasDecoration(def, std::numeric_limits<uint32_t>::max(),
                                   spv::Decoration::Coherent);
      is_volatile |= HasDecoration(def, std::numeric_limits<uint32_t>::max(),
                                   spv::Decoration::Volatile);
      if (is_coherent && is_volatile)
        return std::make_pair(is_coherent, is_volatile);

      // Check the subtypes.
      for (uint32_t i = 0; i < def->NumInOperands(); ++i) {
        stack.push_back(context()->get_def_use_mgr()->GetDef(
            def->GetSingleWordInOperand(i)));
      }
    } else if (spvOpcodeIsComposite(def->opcode())) {
      stack.push_back(context()->get_def_use_mgr()->GetDef(
          def->GetSingleWordInOperand(0u)));
    } else if (def->opcode() == spv::Op::OpTypePointer) {
      stack.push_back(context()->get_def_use_mgr()->GetDef(
          def->GetSingleWordInOperand(1u)));
    }
  }

  return std::make_pair(is_coherent, is_volatile);
}